

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::Generator::OptionsValue
          (string *__return_storage_ptr__,Generator *this,string *serialized_options)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  if ((serialized_options->_M_string_length == 0) ||
     (bVar2 = GeneratingDescriptorProto(this), bVar2)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"None","");
    return __return_storage_ptr__;
  }
  CEscape(&local_38,serialized_options);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x3f6a30);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_48 = *plVar4;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar4;
    local_58 = (long *)*plVar3;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_38._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::OptionsValue(
    const std::string& serialized_options) const {
  if (serialized_options.length() == 0 || GeneratingDescriptorProto()) {
    return "None";
  } else {
    return "b'" + CEscape(serialized_options) + "'";
  }
}